

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaPrs.h
# Opt level: O0

void Prs_ManInitializeNtk(Prs_Man_t *p,int iName,int fSlices)

{
  Prs_Ntk_t *pPVar1;
  Abc_Nam_t *pAVar2;
  Hash_IntMan_t *pHVar3;
  int fSlices_local;
  int iName_local;
  Prs_Man_t *p_local;
  
  if (p->pNtk == (Prs_Ntk_t *)0x0) {
    pPVar1 = (Prs_Ntk_t *)calloc(1,0xf0);
    p->pNtk = pPVar1;
    p->pNtk->iModuleName = iName;
    p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfd | ((byte)fSlices & 1) << 1;
    pAVar2 = Abc_NamRef(p->pStrs);
    p->pNtk->pStrs = pAVar2;
    pAVar2 = Abc_NamRef(p->pFuns);
    p->pNtk->pFuns = pAVar2;
    pHVar3 = Hash_IntManRef(p->vHash);
    p->pNtk->vHash = pHVar3;
    Vec_PtrPush(p->vNtks,p->pNtk);
    return;
  }
  __assert_fail("p->pNtk == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/cba/cbaPrs.h"
                ,0xd7,"void Prs_ManInitializeNtk(Prs_Man_t *, int, int)");
}

Assistant:

static inline void Prs_ManInitializeNtk( Prs_Man_t * p, int iName, int fSlices )
{
    assert( p->pNtk == NULL );
    p->pNtk = ABC_CALLOC( Prs_Ntk_t, 1 );
    p->pNtk->iModuleName = iName;
    p->pNtk->fSlices = fSlices;
    p->pNtk->pStrs = Abc_NamRef( p->pStrs );
    p->pNtk->pFuns = Abc_NamRef( p->pFuns );
    p->pNtk->vHash = Hash_IntManRef( p->vHash );
    Vec_PtrPush( p->vNtks, p->pNtk );
}